

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionRayleighAdvancedGeneric::SetMainInertiasInMassReference
          (ChBeamSectionRayleighAdvancedGeneric *this,double Jmyy,double Jmzz,double phi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  dVar1 = -phi;
  dVar2 = cos(dVar1);
  dVar3 = sin(dVar1);
  dVar4 = cos(dVar1);
  dVar5 = sin(dVar1);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar3 * dVar3;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = Jmyy;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar2 * dVar2;
  dVar1 = (this->super_ChBeamSectionEulerAdvancedGeneric).mu;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar3 * dVar3 * Jmzz;
  auVar6 = vfmadd231sd_fma(auVar8,auVar9,auVar13);
  dVar3 = (this->super_ChBeamSectionEulerAdvancedGeneric).Mz;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar3;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar2 * dVar2 * Jmzz;
  auVar8 = vfmadd231sd_fma(auVar10,auVar13,auVar14);
  dVar2 = (this->super_ChBeamSectionEulerAdvancedGeneric).My;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar2;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1 * dVar3;
  auVar9 = vfmadd231sd_fma(auVar6,auVar16,auVar11);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (Jmzz - Jmyy) * dVar5 * dVar4;
  auVar6 = vfnmadd231sd_fma(auVar6,auVar16,auVar15);
  auVar7._0_8_ = auVar6._0_8_ ^ 0x8000000000000000;
  auVar7._8_8_ = auVar6._8_8_ ^ 0x8000000000000000;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1 * dVar2;
  auVar6 = vfmadd213sd_fma(auVar12,auVar15,auVar8);
  this->Jyy = auVar9._0_8_;
  this->Jzz = auVar6._0_8_;
  dVar1 = (double)vmovlpd_avx(auVar7);
  this->Jyz = dVar1;
  (this->super_ChBeamSectionEulerAdvancedGeneric).Jxx = auVar9._0_8_ + auVar6._0_8_;
  return;
}

Assistant:

void ChBeamSectionRayleighAdvancedGeneric::SetMainInertiasInMassReference(double Jmyy, double Jmzz, double phi) {
		double cc = pow(cos(-phi), 2);
		double ss = pow(sin(-phi), 2);
		double cs = cos(-phi) * sin(-phi);
		// generic 2x2 tensor rotation
		double Tyy_rot = cc * Jmyy + ss * Jmzz; // + 2 * Jmyz * cs; //TODO: it seems the commented term has an opposite sign
		double Tzz_rot = ss * Jmyy + cc * Jmzz; // - 2 * Jmyz * cs;  //TODO: it seems the commented term has an opposite sign
		double Tyz_rot = (Jmzz - Jmyy) * cs; // +Jmyz * (cc - ss);   //TODO: it seems the commented term has an opposite sign
		// add inertia transport 
		this->Jyy = Tyy_rot +  this->mu * this->Mz * this->Mz;
		this->Jzz = Tzz_rot +  this->mu * this->My * this->My;
		this->Jyz = -(Tyz_rot -  this->mu * this->Mz * this->My); // note minus, per definition of Jyz
		// automatically set parent Jxx value
		this->Jxx = (this->Jyy + this->Jzz);
	}